

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f-call-cxx.cpp
# Opt level: O2

void __thiscall TwoDArray::TwoDArray(TwoDArray *this,int n0,int n1)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->n0_ = n0;
  this->n1_ = n1;
  this->array_ = (int **)0x0;
  uVar5 = 0;
  uVar4 = (ulong)(uint)n0 << 3;
  if (n0 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = (ulong)(uint)n0;
  if (n0 < 1) {
    uVar3 = uVar5;
  }
  ppiVar1 = (int **)operator_new__(uVar4);
  this->array_ = ppiVar1;
  uVar4 = (ulong)(uint)n1 << 2;
  if (n1 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    piVar2 = (int *)operator_new__(uVar4);
    this->array_[uVar5] = piVar2;
  }
  return;
}

Assistant:

TwoDArray::TwoDArray(int n0, int n1) {
  int i;
  n0_ = n0;
  n1_ = n1;
  array_ = NULL;
  array_ = new int*[n0];
  for (i = 0; i < n0; i++) {
    array_[i] = new int[n1];
  }
}